

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Scrollbar.cxx
# Opt level: O2

void __thiscall Fl_Scrollbar::draw(Fl_Scrollbar *this)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Fl_Color FVar6;
  uint uVar7;
  uint uVar8;
  _func_int **pp_Var9;
  uint uVar10;
  uint uVar12;
  int iVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar11;
  ulong uVar13;
  
  if ((char)(this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.damage_ < '\0') {
    Fl_Widget::draw_box((Fl_Widget *)this);
  }
  iVar14 = (this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.x_;
  iVar2 = Fl::box_dx((uint)(this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.box_);
  iVar2 = iVar2 + iVar14;
  iVar14 = (this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.y_;
  iVar3 = Fl::box_dy((uint)(this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.box_);
  iVar3 = iVar3 + iVar14;
  iVar14 = (this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.w_;
  iVar4 = Fl::box_dw((uint)(this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.box_);
  iVar14 = iVar14 - iVar4;
  iVar4 = (this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.h_;
  iVar5 = Fl::box_dh((uint)(this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.box_);
  iVar4 = iVar4 - iVar5;
  if (((this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.type_ & 1) == 0) {
    if (SBORROW4(iVar4,iVar14 * 3) != iVar4 + iVar14 * -3 < 0) {
LAB_001c5942:
      Fl_Slider::draw(&this->super_Fl_Slider,iVar2,iVar3,iVar14,iVar4);
      return;
    }
    Fl_Slider::draw(&this->super_Fl_Slider,iVar2,iVar14 + iVar3,iVar14,iVar4 + iVar14 * -2);
    if (-1 < (char)(this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.damage_) {
      return;
    }
    bVar1 = (this->super_Fl_Slider).slider_;
    Fl_Widget::draw_box((Fl_Widget *)this,(uint)((1 < bVar1 && this->pushed_ == 1) | bVar1),iVar2,
                        iVar3,iVar14,iVar14,
                        (this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.color2_);
    bVar1 = (this->super_Fl_Slider).slider_;
    Fl_Widget::draw_box((Fl_Widget *)this,(uint)((1 < bVar1 && this->pushed_ == 2) | bVar1),iVar2,
                        (iVar3 - iVar14) + iVar4,iVar14,iVar14,
                        (this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.color2_);
    iVar5 = Fl_Widget::active_r((Fl_Widget *)this);
    FVar6 = (this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.label_.color;
    if (iVar5 == 0) {
      FVar6 = fl_inactive(FVar6);
    }
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar6);
    uVar7 = (iVar14 + -4) / 3;
    uVar16 = 1;
    if (1 < (int)uVar7) {
      uVar16 = uVar7;
    }
    uVar8 = uVar16 * 2;
    uVar15 = (int)(~uVar8 + iVar14) / 2 + iVar2;
    uVar11 = (ulong)uVar15;
    iVar3 = (int)(~uVar16 + iVar14) / 2 + iVar3;
    iVar2 = Fl::is_scheme("gtk+");
    uVar12 = iVar3 + uVar16;
    uVar13 = (ulong)uVar12;
    if (iVar2 == 0) {
      uVar7 = uVar8 + uVar15;
      uVar8 = uVar15 + uVar16;
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x16])
                (fl_graphics_driver,uVar11,uVar13,(ulong)uVar7,uVar13,(ulong)uVar8,iVar3);
      uVar12 = (iVar4 - iVar14) + iVar3;
      uVar15 = uVar16 + uVar12;
      pp_Var9 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device;
      uVar16 = uVar12;
    }
    else {
      uVar7 = uVar15 + uVar16;
      uVar8 = uVar8 + uVar15;
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x17])
                (fl_graphics_driver,uVar11,uVar13,(ulong)uVar7,(ulong)(uVar12 - 1),(ulong)uVar8,
                 uVar12,uVar7,iVar3);
      uVar15 = iVar3 + (iVar4 - iVar14);
      uVar12 = (iVar4 - iVar14) + iVar3 + 1;
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x16])
                (fl_graphics_driver,uVar11,(ulong)uVar15,(ulong)uVar7,(ulong)uVar12,(ulong)uVar7,
                 uVar16 + uVar15);
      pp_Var9 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device;
      uVar11 = (ulong)uVar7;
      uVar16 = uVar16 + uVar15;
    }
  }
  else {
    if (SBORROW4(iVar14,iVar4 * 3) != iVar14 + iVar4 * -3 < 0) goto LAB_001c5942;
    Fl_Slider::draw(&this->super_Fl_Slider,iVar4 + iVar2,iVar3,iVar14 + iVar4 * -2,iVar4);
    if (-1 < (char)(this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.damage_) {
      return;
    }
    bVar1 = (this->super_Fl_Slider).slider_;
    Fl_Widget::draw_box((Fl_Widget *)this,(uint)((1 < bVar1 && this->pushed_ == 1) | bVar1),iVar2,
                        iVar3,iVar4,iVar4,
                        (this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.color2_);
    bVar1 = (this->super_Fl_Slider).slider_;
    Fl_Widget::draw_box((Fl_Widget *)this,(uint)((1 < bVar1 && this->pushed_ == 2) | bVar1),
                        (iVar14 + iVar2) - iVar4,iVar3,iVar4,iVar4,
                        (this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.color2_);
    iVar5 = Fl_Widget::active_r((Fl_Widget *)this);
    FVar6 = (this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.label_.color;
    if (iVar5 == 0) {
      FVar6 = fl_inactive(FVar6);
    }
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar6);
    uVar8 = (iVar4 + -4) / 3;
    uVar7 = 1;
    if (1 < (int)uVar8) {
      uVar7 = uVar8;
    }
    uVar8 = (int)(~uVar7 + iVar4) / 2 + iVar2;
    uVar12 = (int)(~(uVar7 * 2) + iVar4) / 2 + iVar3;
    iVar2 = Fl::is_scheme("gtk+");
    uVar16 = uVar12 + uVar7;
    uVar10 = uVar8 + uVar7;
    uVar11 = (ulong)uVar10;
    uVar15 = uVar12 + uVar7 * 2;
    if (iVar2 != 0) {
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x17])
                (fl_graphics_driver,(ulong)uVar8,(ulong)uVar16,uVar11,(ulong)uVar15,
                 (ulong)(uVar10 - 1),uVar16,uVar10,uVar12);
      uVar10 = uVar8 + (iVar14 - iVar4);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x17])
                (fl_graphics_driver,(ulong)uVar10,(ulong)uVar12,
                 (ulong)((iVar14 - iVar4) + uVar8 + 1),(ulong)uVar16,(ulong)uVar10,uVar15,
                 uVar7 + uVar10,uVar16);
      return;
    }
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x16])
              (fl_graphics_driver,(ulong)uVar8,(ulong)uVar16,uVar11,(ulong)uVar15,uVar11,uVar12);
    uVar8 = (iVar14 - iVar4) + uVar8;
    uVar7 = uVar7 + uVar8;
    pp_Var9 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device;
    uVar11 = (ulong)uVar8;
  }
  (*pp_Var9[0x16])(fl_graphics_driver,uVar11,(ulong)uVar12,(ulong)uVar8,(ulong)uVar15,(ulong)uVar7,
                   uVar16);
  return;
}

Assistant:

void Fl_Scrollbar::draw() {
  if (damage()&FL_DAMAGE_ALL) draw_box();
  int X = x()+Fl::box_dx(box());
  int Y = y()+Fl::box_dy(box());
  int W = w()-Fl::box_dw(box());
  int H = h()-Fl::box_dh(box());
  if (horizontal()) {
    if (W < 3*H) {Fl_Slider::draw(X,Y,W,H); return;}
    Fl_Slider::draw(X+H,Y,W-2*H,H);
    if (damage()&FL_DAMAGE_ALL) {
      draw_box((pushed_==1) ? fl_down(slider()) : slider(),
	       X, Y, H, H, selection_color());
      draw_box((pushed_==2) ? fl_down(slider()) : slider(),
	       X+W-H, Y, H, H, selection_color());
      if (active_r())
        fl_color(labelcolor());
      else
        fl_color(fl_inactive(labelcolor()));
      int w1 = (H-4)/3; if (w1 < 1) w1 = 1;
      int x1 = X+(H-w1-1)/2;
      int yy1 = Y+(H-2*w1-1)/2;
      if (Fl::is_scheme("gtk+")) {
	fl_polygon(x1, yy1+w1, x1+w1, yy1+2*w1, x1+w1-1, yy1+w1, x1+w1, yy1);
	x1 += (W-H);
	fl_polygon(x1, yy1, x1+1, yy1+w1, x1, yy1+2*w1, x1+w1, yy1+w1);
      } else {
	fl_polygon(x1, yy1+w1, x1+w1, yy1+2*w1, x1+w1, yy1);
	x1 += (W-H);
	fl_polygon(x1, yy1, x1, yy1+2*w1, x1+w1, yy1+w1);
      }
    }
  } else { // vertical
    if (H < 3*W) {Fl_Slider::draw(X,Y,W,H); return;}
    Fl_Slider::draw(X,Y+W,W,H-2*W);
    if (damage()&FL_DAMAGE_ALL) {
      draw_box((pushed_==1) ? fl_down(slider()) : slider(),
	       X, Y, W, W, selection_color());
      draw_box((pushed_==2) ? fl_down(slider()) : slider(),
	       X, Y+H-W, W, W, selection_color());
      if (active_r())
        fl_color(labelcolor());
      else
        fl_color(fl_inactive(labelcolor()));
      int w1 = (W-4)/3; if (w1 < 1) w1 = 1;
      int x1 = X+(W-2*w1-1)/2;
      int yy1 = Y+(W-w1-1)/2;
      if (Fl::is_scheme("gtk+")) {
	fl_polygon(x1, yy1+w1, x1+w1, yy1+w1-1, x1+2*w1, yy1+w1, x1+w1, yy1);
	yy1 += H-W;
	fl_polygon(x1, yy1, x1+w1, yy1+1, x1+w1, yy1+w1);
	fl_polygon(x1+w1, yy1+1, x1+2*w1, yy1, x1+w1, yy1+w1);
      } else {
	fl_polygon(x1, yy1+w1, x1+2*w1, yy1+w1, x1+w1, yy1);
	yy1 += H-W;
	fl_polygon(x1, yy1, x1+w1, yy1+w1, x1+2*w1, yy1);
      }
    }
  }
}